

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunctionRotation_ABCfunctions.cpp
# Opt level: O2

void __thiscall
chrono::ChFunctionRotation_ABCfunctions::ArchiveIN
          (ChFunctionRotation_ABCfunctions *this,ChArchiveIn *marchive)

{
  int foo;
  AngleSet local_84;
  ChNameValue<int> local_80;
  ChNameValue<std::shared_ptr<chrono::ChFunction>_> local_68;
  ChNameValue<std::shared_ptr<chrono::ChFunction>_> local_50;
  ChNameValue<std::shared_ptr<chrono::ChFunction>_> local_38;
  
  ChArchiveIn::VersionRead<chrono::ChFunctionRotation_ABCfunctions>(marchive);
  ChFunctionRotation::ArchiveIN(&this->super_ChFunctionRotation,marchive);
  local_38._value = &this->angleA;
  local_38._name = "angleA";
  local_38._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_38);
  local_50._value = &this->angleB;
  local_50._name = "angleB";
  local_50._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_50);
  local_68._value = &this->angleC;
  local_68._name = "angleC";
  local_68._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_68);
  local_80._value = (int *)&local_84;
  local_80._name = "foo";
  local_80._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_80);
  this->angleset = local_84;
  return;
}

Assistant:

void ChFunctionRotation_ABCfunctions::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChFunctionRotation_ABCfunctions>();
	// deserialize parent class
    ChFunctionRotation::ArchiveIN(marchive);
    // deserialize all member data:
    marchive >> CHNVP(angleA);
	marchive >> CHNVP(angleB);
	marchive >> CHNVP(angleC);
	int foo;
	marchive >> CHNVP(foo);
	angleset = (AngleSet)foo;  //***TODO: use CH_ENUM_MAPPER_BEGIN ... END to serialize enum with readable names
}